

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

int __thiscall CTPNSymBase::has_return_value_on_call(CTPNSymBase *this)

{
  int iVar1;
  CTcSymbol *pCVar2;
  
  pCVar2 = CTcPrsSymtab::find(G_prs->global_symtab_,this->sym_,this->len_);
  if (pCVar2 != (CTcSymbol *)0x0) {
    iVar1 = (*(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
              _vptr_CVmHashEntry[7])(pCVar2);
    return iVar1;
  }
  return 1;
}

Assistant:

int CTPNSymBase::has_return_value_on_call() const
{
    CTcSymbol *sym;
    
    /* try resolving my symbol */
    sym = G_prs->get_global_symtab()->find(sym_, len_);

    /* 
     *   if we found a symbol, let it resolve the call; otherwise, assume
     *   that we do have a return value 
     */
    if (sym != 0)
        return sym->has_return_value_on_call();
    else
        return TRUE;
}